

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int combine_substitute(gen_ctx_t gen_ctx,bb_insn_t_conflict *bb_insn_ref,long *deleted_insns_num)

{
  bool bVar1;
  int iVar2;
  MIR_reg_t MVar3;
  size_t sVar4;
  MIR_op_t *__dest;
  bool bVar5;
  MIR_op_t local_e8;
  MIR_reg_t local_b4;
  MIR_reg_t local_b0;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  MIR_reg_t var;
  MIR_op_t saved_op;
  MIR_op_t *op_ref;
  int success_p;
  int op_change_p;
  int insn_var_change_p;
  int insn_change_p;
  int out_p;
  size_t nops;
  size_t i;
  MIR_insn_t def_insn;
  MIR_insn_t insn;
  bb_insn_t_conflict bb_insn;
  MIR_context_t ctx;
  long *deleted_insns_num_local;
  bb_insn_t_conflict *bb_insn_ref_local;
  gen_ctx_t gen_ctx_local;
  
  bb_insn = (bb_insn_t_conflict)gen_ctx->ctx;
  insn = (MIR_insn_t)*bb_insn_ref;
  def_insn = ((bb_insn_t_conflict)insn)->insn;
  _insn_change_p = *(ulong *)&def_insn->field_0x18 >> 0x20;
  if (_insn_change_p == 0) {
    return 0;
  }
  ctx = (MIR_context_t)deleted_insns_num;
  deleted_insns_num_local = (long *)bb_insn_ref;
  bb_insn_ref_local = (bb_insn_t_conflict *)gen_ctx;
  VARR_MIR_op_ttrunc(gen_ctx->combine_ctx->last_right_ops,0);
  for (nops = 0; nops < _insn_change_p; nops = nops + 1) {
    VARR_MIR_op_tpush((VARR_MIR_op_t *)(bb_insn_ref_local[0x2e]->insn_dead_vars).tail,
                      def_insn->ops[nops]);
  }
  VARR_MIR_reg_ttrunc((VARR_MIR_reg_t *)bb_insn_ref_local[0x2e]->bb,0);
  bitmap_clear(bb_insn_ref_local[0x2e]->call_hard_reg_args);
  for (nops = 0; nops < _insn_change_p; nops = nops + 1) {
    MIR_insn_op_mode((MIR_context_t)bb_insn,def_insn,nops,&insn_var_change_p);
    if ((insn_var_change_p == 0) && ((*(ushort *)&def_insn->ops[nops].field_0x8 & 0xff) != 0xb)) {
      combine_process_op((gen_ctx_t)bb_insn_ref_local,def_insn->ops + nops,(bb_insn_t_conflict)insn)
      ;
    }
  }
  iVar2 = move_code_p((MIR_insn_code_t)*(undefined8 *)&def_insn->field_0x18);
  if ((((iVar2 != 0) && (((ulong)def_insn[1].insn_link.prev & 0xff) == 2)) &&
      (sVar4 = VARR_MIR_reg_tlength((VARR_MIR_reg_t *)bb_insn_ref_local[0x2e]->bb), sVar4 != 0)) &&
     (MVar3 = VARR_MIR_reg_tlast((VARR_MIR_reg_t *)bb_insn_ref_local[0x2e]->bb),
     MVar3 == *(MIR_reg_t *)&def_insn[1].insn_link.next)) {
    early_clobbered_hard_reg2 = *(MIR_reg_t *)&def_insn[1].insn_link.next;
    i = (size_t)get_uptodate_def_insn((gen_ctx_t)bb_insn_ref_local,early_clobbered_hard_reg2);
    if (((MIR_insn_t)i == (MIR_insn_t)0x0) ||
       (iVar2 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&((MIR_insn_t)i)->field_0x18),
       iVar2 != 0)) {
      return 0;
    }
    target_get_early_clobbered_hard_regs((MIR_insn_t)i,&local_b0,&local_b4);
    iVar2 = move_code_p((MIR_insn_code_t)*(undefined8 *)(i + 0x18));
    if ((((iVar2 == 0) && (local_b0 == 0xffffffff)) &&
        ((local_b4 == 0xffffffff &&
         ((((ulong)def_insn[1].insn_link.prev & 0xff) == 2 &&
          (*(MIR_reg_t *)&def_insn[1].insn_link.next == early_clobbered_hard_reg2)))))) &&
       (((*(ushort *)&def_insn->ops[0].field_0x8 & 0xff) != 0xb ||
        ((def_insn->ops[0].u.mem.base != early_clobbered_hard_reg2 &&
         (def_insn->ops[0].u.mem.index != early_clobbered_hard_reg2)))))) {
      memcpy(&early_clobbered_hard_reg1,(void *)(i + 0x20),0x30);
      memcpy((void *)(i + 0x20),def_insn->ops,0x30);
      iVar2 = target_insn_ok_p((gen_ctx_t)bb_insn_ref_local,(MIR_insn_t)i);
      memcpy((void *)(i + 0x20),&early_clobbered_hard_reg1,0x30);
      if (iVar2 == 0) {
        return 0;
      }
      gen_move_insn_before((gen_ctx_t)bb_insn_ref_local,def_insn,(MIR_insn_t)i);
      if ((bb_insn_ref_local[3] != (bb_insn_t_conflict)0x0) && (1 < *(int *)(bb_insn_ref_local + 4))
         ) {
        fprintf((FILE *)bb_insn_ref_local[3],"      moving insn ");
        print_bb_insn((gen_ctx_t)bb_insn_ref_local,*(bb_insn_t_conflict *)i,0);
        fprintf((FILE *)bb_insn_ref_local[3],"      before insn ");
        print_bb_insn((gen_ctx_t)bb_insn_ref_local,(bb_insn_t_conflict)insn,1);
      }
      memcpy((void *)(i + 0x20),def_insn->ops,0x30);
      if ((bb_insn_ref_local[3] != (bb_insn_t_conflict)0x0) && (1 < *(int *)(bb_insn_ref_local + 4))
         ) {
        fprintf((FILE *)bb_insn_ref_local[3],"      changing it to ");
        print_bb_insn((gen_ctx_t)bb_insn_ref_local,*(bb_insn_t_conflict *)i,1);
        fprintf((FILE *)bb_insn_ref_local[3],"      deleting insn ");
        print_bb_insn((gen_ctx_t)bb_insn_ref_local,(bb_insn_t_conflict)insn,1);
      }
      gen_delete_insn((gen_ctx_t)bb_insn_ref_local,def_insn);
      ctx->gen_ctx = (gen_ctx *)((long)&ctx->gen_ctx->ctx + 1);
      *deleted_insns_num_local = *(long *)i;
      return 1;
    }
  }
  op_change_p = 0;
  do {
    do {
      sVar4 = VARR_MIR_reg_tlength((VARR_MIR_reg_t *)bb_insn_ref_local[0x2e]->bb);
      if (sVar4 == 0) {
        return op_change_p;
      }
      early_clobbered_hard_reg2 = VARR_MIR_reg_tpop((VARR_MIR_reg_t *)bb_insn_ref_local[0x2e]->bb);
      i = (size_t)get_uptodate_def_insn((gen_ctx_t)bb_insn_ref_local,early_clobbered_hard_reg2);
    } while (((MIR_insn_t)i == (MIR_insn_t)0x0) ||
            (iVar2 = move_code_p((MIR_insn_code_t)*(undefined8 *)&((MIR_insn_t)i)->field_0x18),
            iVar2 == 0));
    bVar5 = false;
    for (nops = 0; nops < _insn_change_p; nops = nops + 1) {
      saved_op.u.mem.disp = (MIR_disp_t)(def_insn->ops + nops);
      bVar1 = false;
      MIR_insn_op_mode((MIR_context_t)bb_insn,def_insn,nops,&insn_var_change_p);
      if (((insn_var_change_p == 0) && ((*(ushort *)(saved_op.u.mem.disp + 8) & 0xff) == 2)) &&
         (*(MIR_reg_t *)(saved_op.u.mem.disp + 0x10) == early_clobbered_hard_reg2)) {
        memcpy(def_insn->ops + nops,(void *)(i + 0x50),0x30);
        bVar1 = true;
        bVar5 = true;
      }
      else if (((*(ushort *)(saved_op.u.mem.disp + 8) & 0xff) == 0xb) &&
              ((*(MIR_reg_t *)(saved_op.u.mem.disp + 0x20) == early_clobbered_hard_reg2 ||
               (*(MIR_reg_t *)(saved_op.u.mem.disp + 0x24) == early_clobbered_hard_reg2)))) {
        __assert_fail("op_ref->mode != MIR_OP_VAR_MEM || (op_ref->u.var_mem.base != var && op_ref->u.var_mem.index != var)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x228a,"int combine_substitute(gen_ctx_t, bb_insn_t *, long *)");
      }
      if (bVar1) {
        VARR_size_tpush((VARR_size_t *)(bb_insn_ref_local[0x2e]->insn_dead_vars).head,nops);
      }
    }
    if (bVar5) {
      bVar5 = false;
      if (_insn_change_p <= nops) {
        iVar2 = target_insn_ok_p((gen_ctx_t)bb_insn_ref_local,def_insn);
        bVar5 = iVar2 != 0;
      }
      if (bVar5) {
        op_change_p = 1;
      }
      while (sVar4 = VARR_size_tlength((VARR_size_t *)(bb_insn_ref_local[0x2e]->insn_dead_vars).head
                                      ), sVar4 != 0) {
        nops = VARR_size_tpop((VARR_size_t *)(bb_insn_ref_local[0x2e]->insn_dead_vars).head);
        if (bVar5) {
          VARR_MIR_op_tset((VARR_MIR_op_t *)(bb_insn_ref_local[0x2e]->insn_dead_vars).tail,nops,
                           def_insn->ops[nops]);
        }
        else {
          __dest = def_insn->ops + nops;
          VARR_MIR_op_tget(&local_e8,(VARR_MIR_op_t *)(bb_insn_ref_local[0x2e]->insn_dead_vars).tail
                           ,nops);
          memcpy(__dest,&local_e8,0x30);
        }
      }
      if (bVar5) {
        if (i == 0) {
          __assert_fail("def_insn != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x2298,"int combine_substitute(gen_ctx_t, bb_insn_t *, long *)");
        }
        iVar2 = combine_delete_insn((gen_ctx_t)bb_insn_ref_local,(MIR_insn_t)i,
                                    (bb_insn_t_conflict)insn);
        if (iVar2 != 0) {
          ctx->gen_ctx = (gen_ctx *)((long)&ctx->gen_ctx->ctx + 1);
        }
        if ((bb_insn_ref_local[3] != (bb_insn_t_conflict)0x0) &&
           (1 < *(int *)(bb_insn_ref_local + 4))) {
          fprintf((FILE *)bb_insn_ref_local[3],"      changing to ");
          print_bb_insn((gen_ctx_t)bb_insn_ref_local,(bb_insn_t_conflict)insn,1);
        }
      }
    }
  } while( true );
}

Assistant:

static int combine_substitute (gen_ctx_t gen_ctx, bb_insn_t *bb_insn_ref, long *deleted_insns_num) {
  MIR_context_t ctx = gen_ctx->ctx;
  bb_insn_t bb_insn = *bb_insn_ref;
  MIR_insn_t insn = bb_insn->insn, def_insn;
  size_t i, nops = insn->nops;
  int out_p, insn_change_p, insn_var_change_p, op_change_p, success_p;
  MIR_op_t *op_ref, saved_op;
  MIR_reg_t var, early_clobbered_hard_reg1, early_clobbered_hard_reg2;

  if (nops == 0) return FALSE;
  VARR_TRUNC (MIR_op_t, last_right_ops, 0);
  for (i = 0; i < nops; i++) VARR_PUSH (MIR_op_t, last_right_ops, insn->ops[i]);
  VARR_TRUNC (MIR_reg_t, insn_vars, 0);
  bitmap_clear (vars_bitmap);
  for (i = 0; i < nops; i++) {
    MIR_insn_op_mode (ctx, insn, i, &out_p);
    if (out_p || insn->ops[i].mode == MIR_OP_VAR_MEM) continue;
    combine_process_op (gen_ctx, &insn->ops[i], bb_insn);
  }

  if (move_code_p (insn->code) && insn->ops[1].mode == MIR_OP_VAR
      && VARR_LENGTH (MIR_reg_t, insn_vars) != 0
      && VARR_LAST (MIR_reg_t, insn_vars) == insn->ops[1].u.var) {
    /* We can change move src.  Try to change insn the following way:
       r0 = r2 op r3; ...; ... = r0  =>  ...; ... = r2 op r3 */
    var = insn->ops[1].u.var;
    if ((def_insn = get_uptodate_def_insn (gen_ctx, var)) == NULL
        || MIR_call_code_p (def_insn->code))
      return FALSE;
    target_get_early_clobbered_hard_regs (def_insn, &early_clobbered_hard_reg1,
                                          &early_clobbered_hard_reg2);
    if (!move_code_p (def_insn->code) && early_clobbered_hard_reg1 == MIR_NON_VAR
        && early_clobbered_hard_reg2 == MIR_NON_VAR && insn->ops[1].mode == MIR_OP_VAR
        && insn->ops[1].u.var == var
        /* Check that insn->ops[0] is not mem[...hr0...]: */
        && (insn->ops[0].mode != MIR_OP_VAR_MEM
            || (insn->ops[0].u.var_mem.base != var && insn->ops[0].u.var_mem.index != var))) {
      saved_op = def_insn->ops[0];
      def_insn->ops[0] = insn->ops[0];
      success_p = target_insn_ok_p (gen_ctx, def_insn);
      def_insn->ops[0] = saved_op;
      if (!success_p) return FALSE;
      gen_move_insn_before (gen_ctx, insn, def_insn);
      DEBUG (2, {
        fprintf (debug_file, "      moving insn ");
        print_bb_insn (gen_ctx, def_insn->data, FALSE);
        fprintf (debug_file, "      before insn ");
        print_bb_insn (gen_ctx, bb_insn, TRUE);
      });
      def_insn->ops[0] = insn->ops[0];
      DEBUG (2, {
        fprintf (debug_file, "      changing it to ");
        print_bb_insn (gen_ctx, def_insn->data, TRUE);
        fprintf (debug_file, "      deleting insn ");
        print_bb_insn (gen_ctx, bb_insn, TRUE);
      });
      gen_delete_insn (gen_ctx, insn);
      (*deleted_insns_num)++;
      *bb_insn_ref = def_insn->data;
      return TRUE;
    }
  }
  insn_change_p = FALSE;
  while (VARR_LENGTH (MIR_reg_t, insn_vars) != 0) {
    var = VARR_POP (MIR_reg_t, insn_vars);
    if ((def_insn = get_uptodate_def_insn (gen_ctx, var)) == NULL) continue;
    if (!move_code_p (def_insn->code)) continue;
    insn_var_change_p = FALSE;
    for (i = 0; i < nops; i++) { /* Change all var occurences: */
      op_ref = &insn->ops[i];
      op_change_p = FALSE;
      MIR_insn_op_mode (ctx, insn, i, &out_p);
      if (!out_p && op_ref->mode == MIR_OP_VAR && op_ref->u.var == var) {
        /* It is not safe to substitute if there is another use after def insn before
           the current as we delete def insn after substitution. */
        insn->ops[i] = def_insn->ops[1];
        insn_var_change_p = op_change_p = TRUE;
      } else {
        gen_assert (op_ref->mode != MIR_OP_VAR_MEM
                    || (op_ref->u.var_mem.base != var && op_ref->u.var_mem.index != var));
      }
      if (op_change_p) VARR_PUSH (size_t, changed_op_numbers, i);
    }
    if (insn_var_change_p) {
      if ((success_p = i >= nops && target_insn_ok_p (gen_ctx, insn))) insn_change_p = TRUE;
      while (VARR_LENGTH (size_t, changed_op_numbers)) {
        i = VARR_POP (size_t, changed_op_numbers);
        if (success_p)
          VARR_SET (MIR_op_t, last_right_ops, i, insn->ops[i]);
        else
          insn->ops[i] = VARR_GET (MIR_op_t, last_right_ops, i); /* restore changed operands */
      }
      if (success_p) {
        gen_assert (def_insn != NULL);
        if (combine_delete_insn (gen_ctx, def_insn, bb_insn)) (*deleted_insns_num)++;
        DEBUG (2, {
          fprintf (debug_file, "      changing to ");
          print_bb_insn (gen_ctx, bb_insn, TRUE);
        });
      }
    }
  }
  return insn_change_p;
}